

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

void __thiscall foxxll::config::find_config(config *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string basepath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  allocator local_89;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pcVar2 = getenv("STXXLCFG");
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::string((string *)&local_88,pcVar2,(allocator *)&local_b0);
    bVar1 = exist_file(&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_88,pcVar2,(allocator *)&local_b0);
      (*this->_vptr_config[4])(this,&local_88);
      goto LAB_00144537;
    }
  }
  pcVar2 = getenv("HOSTNAME");
  pcVar3 = getenv("HOME");
  (*this->_vptr_config[8])(&local_b0,this);
  std::operator+(&local_88,"./",&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  if (pcVar2 == (char *)0x0) {
LAB_001444d8:
    std::operator+(&local_b0,&local_88,"");
    bVar1 = exist_file(&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    if (bVar1) {
      std::operator+(&local_b0,&local_88,"");
      (*this->_vptr_config[4])(this,&local_b0);
    }
    else {
      std::__cxx11::string::~string((string *)&local_88);
      if (pcVar3 == (char *)0x0) goto LAB_001446f7;
      std::__cxx11::string::string((string *)&local_48,pcVar3,&local_89);
      std::operator+(&local_b0,&local_48,"/");
      (*this->_vptr_config[8])(&local_68,this);
      std::operator+(&local_88,&local_b0,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_48);
      if (pcVar2 != (char *)0x0) {
        std::operator+(&local_68,&local_88,".");
        std::operator+(&local_48,&local_68,pcVar2);
        std::operator+(&local_b0,&local_48,"");
        bVar1 = exist_file(&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_48);
        std::__cxx11::string::~string((string *)&local_68);
        if (bVar1) {
          std::operator+(&local_68,&local_88,".");
          std::operator+(&local_48,&local_68,pcVar2);
          std::operator+(&local_b0,&local_48,"");
          (*this->_vptr_config[4])(this,&local_b0);
          goto LAB_001444bd;
        }
      }
      std::operator+(&local_b0,&local_88,"");
      bVar1 = exist_file(&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      if (!bVar1) {
        std::__cxx11::string::~string((string *)&local_88);
LAB_001446f7:
        (*this->_vptr_config[5])(this);
        return;
      }
      std::operator+(&local_b0,&local_88,"");
      (*this->_vptr_config[4])(this,&local_b0);
    }
    this_00 = &local_b0;
  }
  else {
    std::operator+(&local_68,&local_88,".");
    std::operator+(&local_48,&local_68,pcVar2);
    std::operator+(&local_b0,&local_48,"");
    bVar1 = exist_file(&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    if (!bVar1) goto LAB_001444d8;
    std::operator+(&local_68,&local_88,".");
    std::operator+(&local_48,&local_68,pcVar2);
    std::operator+(&local_b0,&local_48,"");
    (*this->_vptr_config[4])(this,&local_b0);
LAB_001444bd:
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_48);
    this_00 = &local_68;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_00144537:
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

void config::find_config()
{
    // check several locations for disk configuration files

    // check STXXLCFG environment path
    const char* cfg = getenv("STXXLCFG");
    if (cfg && exist_file(cfg))
        return load_config_file(cfg);

#if !FOXXLL_WINDOWS
    // read environment, unix style
    const char* hostname = getenv("HOSTNAME");
    const char* home = getenv("HOME");
    const char* suffix = "";
#else
    // read environment, windows style
    const char* hostname = getenv("COMPUTERNAME");
    const char* home = getenv("APPDATA");
    const char* suffix = ".txt";
#endif

    // check current directory
    {
        std::string basepath = "./" + default_config_file_name();

        if (hostname && exist_file(basepath + "." + hostname + suffix))
            return load_config_file(basepath + "." + hostname + suffix);

        if (exist_file(basepath + suffix))
            return load_config_file(basepath + suffix);
    }

    // check home directory
    if (home)
    {
        std::string basepath =
            std::string(home) + "/" + default_config_file_name();

        if (hostname && exist_file(basepath + "." + hostname + suffix))
            return load_config_file(basepath + "." + hostname + suffix);

        if (exist_file(basepath + suffix))
            return load_config_file(basepath + suffix);
    }

    // load default configuration
    load_default_config();
}